

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_nondecryptable_initial(void)

{
  int iVar1;
  size_t sVar2;
  int ret;
  quicly_decoded_packet_t decoded;
  size_t num_decoded;
  iovec packet;
  uint8_t packetbuf [1280];
  quicly_conn_t *server;
  uint8_t header [18];
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  iovec *in_stack_fffffffffffffa38;
  quicly_decoded_packet_t *in_stack_fffffffffffffa40;
  quicly_address_token_plaintext_t *in_stack_fffffffffffffb18;
  quicly_decoded_packet_t *in_stack_fffffffffffffb20;
  sockaddr *in_stack_fffffffffffffb28;
  sockaddr *in_stack_fffffffffffffb30;
  quicly_context_t *in_stack_fffffffffffffb38;
  quicly_conn_t **in_stack_fffffffffffffb40;
  quicly_cid_plaintext_t *in_stack_fffffffffffffb50;
  ptls_handshake_properties_t *in_stack_fffffffffffffb58;
  
  memset(&stack0xfffffffffffffaea,0,0x4ee);
  sVar2 = decode_packets(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                         CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  _ok((int)(ulong)(sVar2 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x231)
  ;
  new_master_id();
  iVar1 = quicly_accept(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                        in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                        in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                        in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  _ok((int)(ulong)(iVar1 == 0xff09),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x235)
  ;
  return;
}

Assistant:

static void test_nondecryptable_initial(void)
{
#define PACKET_LEN 1280
#define HEADER_LEN 18
#define LEN_HIGH (((PACKET_LEN - HEADER_LEN) & 0xff00) >> 8)
#define LEN_LOW ((PACKET_LEN - HEADER_LEN) & 0xff)
    uint8_t header[HEADER_LEN] = {
        /* first byte for Initial: 0b1100???? */
        0xc5,
        /* version (29) */
        0xff,
        0x00,
        0x00,
        0x1d,
        /* DCID len */
        0x08,
        /* DCID */
        0x83,
        0x94,
        0xc8,
        0xf0,
        0x3e,
        0x51,
        0x57,
        0x08,
        /* SCID len */
        0x00,
        /* SCID does not appear */
        /* token length */
        0x00,
        /* token does not appear */
        /* length */
        (0x40 | LEN_HIGH),
        LEN_LOW,
    };
    quicly_conn_t *server;
    uint8_t packetbuf[PACKET_LEN];
    struct iovec packet = {.iov_base = packetbuf, .iov_len = sizeof(packetbuf)};
    size_t num_decoded;
    quicly_decoded_packet_t decoded;
    int ret;

    /* create an Initial packet, with its payload all set to zero */
    memcpy(packetbuf, header, sizeof(header));
    memset(packetbuf + sizeof(header), 0, sizeof(packetbuf) - sizeof(header));
    num_decoded = decode_packets(&decoded, &packet, 1);
    ok(num_decoded == 1);

    /* decryption should fail */
    ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
    ok(ret == QUICLY_ERROR_DECRYPTION_FAILED);
#undef PACKET_LEN
#undef HEADER_LEN
#undef LEN_HIGH
#undef LEN_LOW
}